

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

size_t __thiscall
DSectorPlaneInterpolation::PointerSubstitution
          (DSectorPlaneInterpolation *this,DObject *old,DObject *notOld)

{
  DInterpolation **ppDVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(this->attached).Count;
  uVar2 = 0;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      ppDVar1 = (this->attached).Array;
      if (ppDVar1[uVar4] == (DInterpolation *)old) {
        ppDVar1[uVar4] = (DInterpolation *)notOld;
        uVar2 = (ulong)((int)uVar2 + 1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    uVar2 = (ulong)(int)uVar2;
  }
  return uVar2;
}

Assistant:

size_t DSectorPlaneInterpolation::PointerSubstitution (DObject *old, DObject *notOld)
{
	int subst = 0;
	for(unsigned i=0; i<attached.Size(); i++)
	{
		if (attached[i] == old) 
		{
			attached[i] = (DInterpolation*)notOld;
			subst++;
		}
	}
	return subst;
}